

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacCom.c
# Opt level: O0

int Bac_CommandWrite(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Bac_Man_t *p_00;
  Vec_Ptr_t *vDes;
  char *pcVar4;
  Vec_Ptr_t *vPtr;
  int fVerbose;
  int c;
  int fUsePtr;
  int fUseAssign;
  char *pFileName;
  Bac_Man_t *p;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  p_00 = Bac_AbcGetMan(pAbc);
  c = 1;
  bVar1 = false;
  bVar2 = false;
  Extra_UtilGetoptReset();
LAB_003a4a34:
  iVar3 = Extra_UtilGetopt(argc,argv,"apvh");
  if (iVar3 == -1) {
    if (p_00 == (Bac_Man_t *)0x0) {
      Abc_Print(1,"Bac_CommandWrite(): There is no current design.\n");
    }
    else {
      if (argc == globalUtilOptind + 1) {
        _fUsePtr = argv[globalUtilOptind];
      }
      else {
        if ((argc != globalUtilOptind) || (p_00 == (Bac_Man_t *)0x0)) {
          printf("Output file name should be given on the command line.\n");
          return 0;
        }
        pcVar4 = Bac_ManName(p_00);
        _fUsePtr = Extra_FileNameGenericAppend(pcVar4,"_out.v");
      }
      pcVar4 = Extra_FileNameExtension(_fUsePtr);
      iVar3 = strcmp(pcVar4,"blif");
      if (iVar3 == 0) {
        Bac_ManWriteBlif(_fUsePtr,p_00);
      }
      else {
        pcVar4 = Extra_FileNameExtension(_fUsePtr);
        iVar3 = strcmp(pcVar4,"v");
        if (iVar3 == 0) {
          if (bVar1) {
            vDes = Bac_PtrDeriveFromCba(p_00);
            if (vDes == (Vec_Ptr_t *)0x0) {
              printf("Converting to Ptr has failed.\n");
            }
            else {
              Bac_PtrDumpVerilog(_fUsePtr,vDes);
              Bac_PtrFree(vDes);
            }
          }
          else {
            Bac_ManWriteVerilog(_fUsePtr,p_00,c);
          }
        }
        else {
          pcVar4 = Extra_FileNameExtension(_fUsePtr);
          iVar3 = strcmp(pcVar4,"bac");
          if (iVar3 != 0) {
            printf("Unrecognized output file extension.\n");
            return 0;
          }
          Bac_ManWriteBac(_fUsePtr,p_00);
        }
      }
    }
    return 0;
  }
  switch(iVar3) {
  case 0x61:
    c = c ^ 1;
    goto LAB_003a4a34;
  default:
    break;
  case 0x68:
    break;
  case 0x70:
    bVar1 = (bool)(bVar1 ^ 1);
    goto LAB_003a4a34;
  case 0x76:
    goto switchD_003a4a72_caseD_76;
  }
  Abc_Print(-2,"usage: @_write [-apvh]\n");
  Abc_Print(-2,"\t         writes the design into a file in BLIF or Verilog\n");
  pcVar4 = "no";
  if (c != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-a     : toggle using assign-statement for primitives [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-p     : toggle using Ptr construction (mapped Verilog only) [default = %s]\n",
            pcVar4);
  pcVar4 = "no";
  if (bVar2) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_003a4a72_caseD_76:
  bVar2 = (bool)(bVar2 ^ 1);
  goto LAB_003a4a34;
}

Assistant:

int Bac_CommandWrite( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Bac_Man_t * p = Bac_AbcGetMan(pAbc);
    char * pFileName = NULL;
    int fUseAssign   =    1;
    int fUsePtr      =    0; 
    int c, fVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "apvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fUseAssign ^= 1;
            break;
        case 'p':
            fUsePtr ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( p == NULL )
    {
        Abc_Print( 1, "Bac_CommandWrite(): There is no current design.\n" );
        return 0;
    }
    if ( argc == globalUtilOptind + 1 )
        pFileName = argv[globalUtilOptind];
    else if ( argc == globalUtilOptind && p )
        pFileName = Extra_FileNameGenericAppend( Bac_ManName(p), "_out.v" );
    else 
    {
        printf( "Output file name should be given on the command line.\n" );
        return 0;
    }
    // perform writing
    if ( !strcmp( Extra_FileNameExtension(pFileName), "blif" )  )
        Bac_ManWriteBlif( pFileName, p );
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "v" )  )
    {
        if ( fUsePtr )
        {
            Vec_Ptr_t * vPtr = Bac_PtrDeriveFromCba( p );
            if ( vPtr == NULL )
                printf( "Converting to Ptr has failed.\n" );
            else
            {
                Bac_PtrDumpVerilog( pFileName, vPtr );
                Bac_PtrFree( vPtr ); 
            }
        }
        else
            Bac_ManWriteVerilog( pFileName, p, fUseAssign );        
    }
    else if ( !strcmp( Extra_FileNameExtension(pFileName), "bac" )  )
        Bac_ManWriteBac( pFileName, p );
    else 
    {
        printf( "Unrecognized output file extension.\n" );
        return 0;
    }
    return 0;
usage:
    Abc_Print( -2, "usage: @_write [-apvh]\n" );
    Abc_Print( -2, "\t         writes the design into a file in BLIF or Verilog\n" );
    Abc_Print( -2, "\t-a     : toggle using assign-statement for primitives [default = %s]\n",  fUseAssign? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle using Ptr construction (mapped Verilog only) [default = %s]\n", fUsePtr? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}